

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::MakeDirectory(string *path,mode_t *mode)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  string local_98 [32];
  undefined1 local_78 [8];
  string topdir;
  size_type pos;
  undefined1 local_40 [8];
  string dir;
  mode_t *mode_local;
  string *path_local;
  
  dir.field_2._8_8_ = mode;
  bVar1 = PathExists(path);
  if (bVar1) {
    bVar1 = FileIsDirectory(path);
    return bVar1;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    return false;
  }
  std::__cxx11::string::string((string *)local_40,(string *)path);
  ConvertToUnixSlashes((string *)local_40);
  topdir.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_78);
  while (topdir.field_2._8_8_ = std::__cxx11::string::find((char)local_40,0x2f),
        topdir.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_40);
    std::__cxx11::string::operator=((string *)local_78,local_98);
    std::__cxx11::string::~string(local_98);
    iVar2 = Mkdir((string *)local_78);
    if ((iVar2 == 0) && (dir.field_2._8_8_ != 0)) {
      SetPermissions((string *)local_78,*(mode_t *)dir.field_2._8_8_,false);
    }
    topdir.field_2._8_8_ = topdir.field_2._8_8_ + 1;
  }
  std::__cxx11::string::operator=((string *)local_78,(string *)local_40);
  iVar2 = Mkdir((string *)local_78);
  if (iVar2 == 0) {
    if (dir.field_2._8_8_ != 0) {
      SetPermissions((string *)local_78,*(mode_t *)dir.field_2._8_8_,false);
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      path_local._7_1_ = false;
      goto LAB_0062eb5e;
    }
  }
  path_local._7_1_ = true;
LAB_0062eb5e:
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return path_local._7_1_;
}

Assistant:

bool SystemTools::MakeDirectory(const std::string& path, const mode_t* mode)
{
  if (SystemTools::PathExists(path)) {
    return SystemTools::FileIsDirectory(path);
  }
  if (path.empty()) {
    return false;
  }
  std::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  std::string::size_type pos = 0;
  std::string topdir;
  while ((pos = dir.find('/', pos)) != std::string::npos) {
    topdir = dir.substr(0, pos);

    if (Mkdir(topdir) == 0 && mode != KWSYS_NULLPTR) {
      SystemTools::SetPermissions(topdir, *mode);
    }

    ++pos;
  }
  topdir = dir;
  if (Mkdir(topdir) != 0) {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if ((errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
    ) {
      return false;
    }
  } else if (mode != KWSYS_NULLPTR) {
    SystemTools::SetPermissions(topdir, *mode);
  }

  return true;
}